

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

Bitmap * __thiscall lunasvg::Bitmap::operator=(Bitmap *this,Bitmap *bitmap)

{
  Bitmap local_20;
  Bitmap *local_18;
  Bitmap *bitmap_local;
  Bitmap *this_local;
  
  local_18 = bitmap;
  bitmap_local = this;
  Bitmap(&local_20,bitmap);
  swap(&local_20,this);
  ~Bitmap(&local_20);
  return this;
}

Assistant:

Bitmap& Bitmap::operator=(Bitmap&& bitmap)
{
    Bitmap(std::move(bitmap)).swap(*this);
    return *this;
}